

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderInvarianceTests::init(ShaderInvarianceTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  undefined1 auVar2 [8];
  TestNode *node;
  BasicInvarianceTest *pBVar3;
  long *plVar4;
  long lVar5;
  FormatArgumentList *pFVar6;
  char *pcVar7;
  size_type *psVar8;
  char **value;
  char **value_00;
  char **value_01;
  char **value_02;
  char **value_03;
  Precision PVar9;
  char *__end_1;
  char *pcVar10;
  char *__end_2;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  Precision PVar14;
  bool bVar15;
  FormatArgumentList args;
  char *__end;
  undefined1 local_658 [32];
  _Base_ptr local_638;
  size_t local_630;
  allocator<char> local_624;
  allocator<char> local_623;
  allocator<char> local_622;
  allocator<char> local_621;
  long *local_620;
  long local_618;
  long local_610 [2];
  string local_600;
  string local_5e0;
  long *local_5c0;
  long local_5b8;
  long local_5b0 [2];
  long *local_5a0;
  long local_598;
  long local_590 [2];
  undefined1 local_580 [8];
  _Alloc_hider local_578;
  size_type local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_568;
  string local_558;
  undefined1 local_538 [8];
  _Alloc_hider local_530;
  undefined1 local_528 [24];
  undefined1 local_510 [8];
  _Alloc_hider local_508;
  undefined1 local_500 [24];
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  undefined1 local_4c0 [8];
  _Alloc_hider local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined1 local_498 [8];
  _Alloc_hider local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  undefined1 local_470 [8];
  _Alloc_hider local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [8];
  _Alloc_hider local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  undefined1 local_420 [8];
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 local_3f8 [8];
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  undefined1 local_3d0 [8];
  _Alloc_hider local_3c8;
  size_type local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  char *local_3a8;
  undefined1 local_3a0 [8];
  _Alloc_hider local_398;
  size_type local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  undefined1 local_378 [8];
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  Precision local_350;
  Precision local_34c;
  undefined1 local_348 [8];
  _Alloc_hider local_340;
  undefined1 local_338 [24];
  BasicInvarianceTest *local_320;
  undefined1 local_318 [8];
  _Alloc_hider local_310;
  undefined1 local_308 [96];
  ios_base local_2a8 [264];
  string local_1a0;
  string local_180;
  string local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  long *local_110;
  long local_108;
  long local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long local_50;
  Context *local_48;
  size_type *local_40;
  char *local_38;
  
  lVar5 = 0;
  do {
    pcVar7 = init::precisions[lVar5].name;
    local_350 = init::precisions[lVar5].prec;
    local_50 = lVar5;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,pcVar7,
               "Invariance tests using the given precision.");
    local_658._8_4_ = _S_red;
    pFVar6 = (FormatArgumentList *)0x0;
    local_658._16_8_ = 0;
    local_658._24_8_ = local_658 + 8;
    local_630 = 0;
    local_620 = local_610;
    local_638 = (_Base_ptr)local_658._24_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"");
    local_3f8 = (undefined1  [8])0x67b50f;
    local_3f0._M_p = (pointer)&local_3e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f0,local_620,local_618 + (long)local_620);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_3f8);
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"attribute","");
    local_420 = (undefined1  [8])0x677fa2;
    local_418._M_p = (pointer)&local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,local_558._M_dataplus._M_p,
               local_558._M_dataplus._M_p + local_558._M_string_length);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_420);
    local_5a0 = local_590;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"varying","");
    local_448 = (undefined1  [8])0x67a12c;
    local_440._M_p = (pointer)&local_430;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_440,local_5a0,local_598 + (long)local_5a0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_448);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,pcVar7,&local_621);
    local_470 = (undefined1  [8])0x64fb9c;
    local_468._M_p = (pointer)&local_458;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_468,local_5c0,local_5b8 + (long)local_5c0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_470);
    de::toString<char_const*>(&local_5e0,(de *)&init::precisions[lVar5].highValue,value);
    local_498 = (undefined1  [8])0x64fba4;
    local_490._M_p = (pointer)&local_480;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_490,local_5e0._M_dataplus._M_p,
               local_5e0._M_dataplus._M_p + local_5e0._M_string_length);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_498);
    de::toString<char_const*>(&local_600,(de *)&init::precisions[lVar5].invHighValue,value_00);
    local_4c0 = (undefined1  [8])0x64fbaf;
    local_4b8._M_p = (pointer)&local_4a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4b8,local_600._M_dataplus._M_p,
               local_600._M_dataplus._M_p + local_600._M_string_length);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_4c0);
    de::toString<char_const*>(&local_160,(de *)&init::precisions[lVar5].mediumValue,value_01);
    local_4e8 = (undefined1  [8])0x64fbbe;
    local_4e0._M_p = (pointer)&local_4d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_4e8);
    de::toString<char_const*>(&local_180,(de *)&init::precisions[lVar5].lowValue,value_02);
    local_378 = (undefined1  [8])0x64fbcb;
    local_370._M_p = (pointer)&local_360;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_180._M_dataplus._M_p,
               local_180._M_dataplus._M_p + local_180._M_string_length);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_378);
    de::toString<char_const*>(&local_1a0,(de *)&init::precisions[lVar5].invlowValue,value_03);
    local_580 = (undefined1  [8])0x64fbd5;
    local_578._M_p = (pointer)&aStack_568;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_578,local_1a0._M_dataplus._M_p,
               local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_580);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    std::ostream::operator<<((FormatArgument *)local_318,init::precisions[lVar5].loopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    local_3d0 = (undefined1  [8])0x64fbe3;
    local_3c8._M_p = (pointer)&local_3b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c8,local_70,local_68 + (long)local_70);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_3d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    std::ostream::operator<<
              ((FormatArgument *)local_318,init::precisions[lVar5].loopPartialIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    local_348 = (undefined1  [8])0x64fbee;
    local_340._M_p = local_338 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,local_90,local_88 + (long)local_90);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_348);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    std::ostream::operator<<
              ((FormatArgument *)local_318,init::precisions[lVar5].loopNormalizationExponent);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    local_3a0 = (undefined1  [8])0x64fc01;
    local_398._M_p = (pointer)&local_388;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_398,local_b0,local_a8 + (long)local_b0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_3a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,init::precisions[lVar5].loopNormalizationConstantLiteral,
               &local_622);
    local_318 = (undefined1  [8])0x64fc29;
    local_310._M_p = local_308 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,local_d0,local_c8 + (long)local_d0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,init::precisions[lVar5].loopMultiplier,&local_623);
    local_510 = (undefined1  [8])0x64fc15;
    local_508._M_p = local_500 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,local_f0,local_e8 + (long)local_f0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_510);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,init::precisions[lVar5].sumLoopNormalizationConstantLiteral,
               &local_624);
    local_538 = (undefined1  [8])0x64fc25;
    local_530._M_p = local_528 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_530,local_110,local_108 + (long)local_110);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_658,(FormatArgument *)local_538);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_140,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_658);
    if (local_530._M_p != local_528 + 8) {
      operator_delete(local_530._M_p,local_528._8_8_ + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if (local_508._M_p != local_500 + 8) {
      operator_delete(local_508._M_p,local_500._8_8_ + 1);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    if (local_310._M_p != local_308 + 8) {
      operator_delete(local_310._M_p,local_308._8_8_ + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_p != &local_388) {
      operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_340._M_p != local_338 + 8) {
      operator_delete(local_340._M_p,local_338._8_8_ + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_p != &local_3b8) {
      operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_p != &aStack_568) {
      operator_delete(local_578._M_p,aStack_568._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_p != &local_360) {
      operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_p != &local_4d0) {
      operator_delete(local_4e0._M_p,local_4d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_p != &local_4a8) {
      operator_delete(local_4b8._M_p,local_4a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_p != &local_480) {
      operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_p != &local_458) {
      operator_delete(local_468._M_p,local_458._M_allocated_capacity + 1);
    }
    if (local_5c0 != local_5b0) {
      operator_delete(local_5c0,local_5b0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_p != &local_430) {
      operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
    }
    if (local_5a0 != local_590) {
      operator_delete(local_5a0,local_590[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_p != &local_3e0) {
      operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
    }
    if (local_620 != local_610) {
      operator_delete(local_620,local_610[0] + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_658);
    tcu::TestNode::addChild((TestNode *)this,node);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = a_input.xzxz + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * (1.08 * a_input.zyzy * a_input.xzxz) * ${HIGH_VALUE_INV} * (a_input.z * a_input.zzxz - a_input.z * a_input.zzxz) + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) / ${HIGH_VALUE};\n\tgl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n}\n"
               ,(char *)&local_140,pFVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n}\n"
               ,(char *)&local_140,pFVar6);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_0",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy - ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n\t${IN_PREC} vec4 d = (${LOW_VALUE} * a_input.yzxx) * (${LOW_VALUE} * a_input.yzzw) * (1.1*${LOW_VALUE_INV} * a_input.yzxx) * (${LOW_VALUE_INV} * a_input.xzzy);\n\t${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n\tv_unrelated = a + b + c + d + e;\n\tgl_Position = a_input + fract(c) + e;\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n\t${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + fract(c) + e;\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_1",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n\t${IN_PREC} vec4 b = (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) * (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\t${IN_PREC} vec4 c = a * a;\n\t${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\tv_unrelated = a + b + c + d;\n\tgl_Position = a_input + d;\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n\t${IN_PREC} vec4 c = a * a;\n\t${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + d;\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_2",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} float x = a_input.x * 0.2;\n\t${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n\t${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n\t${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n\t${IN_PREC} vec4 f = x*a + x*b + x*c;\n\tv_unrelated = f;\n\t${IN_PREC} vec4 g = x * (a + b + c);\n\tgl_Position = a_input + g;\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} float x = a_input.x * 0.2;\n\t${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n\t${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n\t${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 g = x * (a + b + c);\n\tgl_Position = a_input + g;\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_3",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    PVar9 = PRECISION_LOWP;
    do {
      local_3a8 = glu::getPrecisionName(PVar9);
      PVar14 = local_350;
      if ((int)PVar9 < (int)local_350) {
        PVar14 = PVar9;
      }
      bVar15 = PVar14 == PRECISION_LOWP;
      pcVar7 = "1.0e1, 5.0e2, 2.0e2, 1.0";
      if (bVar15) {
        pcVar7 = "0.8, 0.4, -0.2, 0.3";
      }
      pcVar13 = "vec4(fract(used2 / 1.0e2).xyz - fract(used2 / 1.0e3).xyz, 0.0)";
      if (bVar15) {
        pcVar13 = "vec4(fract(used2).xyz, 0.0)";
      }
      pcVar12 = "vec4(fract(unrelated2 / 1.0e2).xyz - fract(unrelated2 / 1.0e3).xyz, 0.0)";
      if (bVar15) {
        pcVar12 = "vec4(fract(unrelated2).xyz, 0.0)";
      }
      local_320 = (BasicInvarianceTest *)operator_new(0xf8);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      local_34c = PVar9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3d0,local_3a8,(allocator<char> *)&local_160);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_3d0,0,(char *)0x0,0x650c14);
      local_580 = (undefined1  [8])&local_570;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar8) {
        local_570 = *psVar8;
        aStack_568._M_allocated_capacity = plVar4[3];
      }
      else {
        local_570 = *psVar8;
        local_580 = (undefined1  [8])*plVar4;
      }
      auVar2 = local_580;
      local_578._M_p = (pointer)plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_318,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3a0,local_3a8,(allocator<char> *)&local_180);
      local_3f8 = (undefined1  [8])0x650f36;
      local_3f0._M_p = (pointer)&local_3e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3f0,local_3a0,local_398._M_p + (long)local_3a0);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_318,(FormatArgument *)local_3f8);
      local_510 = (undefined1  [8])local_500;
      local_38 = pcVar7 + (ulong)(PVar14 != PRECISION_LOWP) * 5 + 0x13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_510,pcVar7);
      local_420 = (undefined1  [8])0x64fc1a;
      local_418._M_p = (pointer)&local_408;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,local_510,local_508._M_p + (long)local_510);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_318,(FormatArgument *)local_420);
      local_40 = (size_type *)auVar2;
      pFVar6 = (FormatArgumentList *)local_528;
      pcVar10 = pcVar13 + 0x3e;
      if (PVar14 == PRECISION_LOWP) {
        pcVar10 = pcVar13 + 0x1b;
      }
      local_538 = (undefined1  [8])pFVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_538,pcVar13,pcVar10);
      local_448 = (undefined1  [8])0x650f45;
      local_440._M_p = (pointer)&local_430;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440,local_538,local_530._M_p + (long)local_538);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_318,(FormatArgument *)local_448);
      local_620 = local_610;
      pcVar11 = pcVar12 + 0x48;
      if (PVar14 == PRECISION_LOWP) {
        pcVar11 = pcVar12 + 0x20;
      }
      local_48 = pCVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,pcVar12,pcVar11);
      local_470 = (undefined1  [8])0x650f54;
      local_468._M_p = (pointer)&local_458;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_620,local_618 + (long)local_620);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_318,(FormatArgument *)local_470);
      (anonymous_namespace)::formatGLSL_abi_cxx11_
                ((string *)local_348,
                 (_anonymous_namespace_ *)
                 "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${UNRELATED_PREC} vec4 unrelated0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${UNRELATED_PREC} vec4 unrelated1 = vec4(${MULTIPLIER}) * unrelated0.xywz + unrelated0;\n\t${UNRELATED_PREC} vec4 unrelated2 = refract(unrelated1, unrelated0, distance(unrelated0, unrelated1));\n\tv_unrelated = a_input + 0.02 * ${NORMALIZE_UNRELATED};\n\t${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n\t${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n\tgl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n}\n"
                 ,(char *)local_318,pFVar6);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_658,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a0,local_3a8,(allocator<char> *)&local_1a0);
      local_498 = (undefined1  [8])0x650f36;
      local_490._M_p = (pointer)&local_480;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_490,local_5a0,local_598 + (long)local_5a0);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_658,(FormatArgument *)local_498);
      local_5c0 = local_5b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,pcVar7,local_38);
      local_4c0 = (undefined1  [8])0x64fc1a;
      local_4b8._M_p = (pointer)&local_4a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b8,local_5c0,local_5b8 + (long)local_5c0);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_658,(FormatArgument *)local_4c0);
      local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,pcVar13,pcVar10);
      local_4e8 = (undefined1  [8])0x650f45;
      local_4e0._M_p = (pointer)&local_4d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,local_5e0._M_dataplus._M_p,
                 local_5e0._M_dataplus._M_p + local_5e0._M_string_length);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_658,(FormatArgument *)local_4e8);
      local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,pcVar12,pcVar11);
      local_378 = (undefined1  [8])0x650f54;
      local_370._M_p = (pointer)&local_360;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,local_600._M_dataplus._M_p,
                 local_600._M_dataplus._M_p + local_600._M_string_length);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_658,(FormatArgument *)local_378);
      (anonymous_namespace)::formatGLSL_abi_cxx11_
                (&local_558,
                 (_anonymous_namespace_ *)
                 "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n\t${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n\tgl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n}\n"
                 ,(char *)local_658,pFVar6);
      pBVar3 = local_320;
      pcVar7 = "Shader shares subexpression of different precision with an unrelated variable.";
      anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
                (local_320,local_48,(char *)local_40,
                 "Shader shares subexpression of different precision with an unrelated variable.",
                 (string *)local_348,&local_558);
      tcu::TestNode::addChild(node,(TestNode *)pBVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      PVar9 = local_34c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != &local_360) {
        operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._M_dataplus._M_p != &local_600.field_2) {
        operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_p != &local_4d0) {
        operator_delete(local_4e0._M_p,local_4d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
        operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_p != &local_4a8) {
        operator_delete(local_4b8._M_p,local_4a8._M_allocated_capacity + 1);
      }
      if (local_5c0 != local_5b0) {
        operator_delete(local_5c0,local_5b0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_p != &local_480) {
        operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
      }
      if (local_5a0 != local_590) {
        operator_delete(local_5a0,local_590[0] + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_658);
      if (local_348 != (undefined1  [8])local_338) {
        operator_delete((void *)local_348,local_338._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_p != &local_458) {
        operator_delete(local_468._M_p,local_458._M_allocated_capacity + 1);
      }
      if (local_620 != local_610) {
        operator_delete(local_620,local_610[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_p != &local_430) {
        operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
      }
      if (local_538 != (undefined1  [8])local_528) {
        operator_delete((void *)local_538,local_528._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if (local_510 != (undefined1  [8])local_500) {
        operator_delete((void *)local_510,local_500._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_p != &local_3e0) {
        operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
      }
      if (local_3a0 != (undefined1  [8])&local_390) {
        operator_delete((void *)local_3a0,local_390 + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_318);
      if (local_580 != (undefined1  [8])&local_570) {
        operator_delete((void *)local_580,local_570 + 1);
      }
      if (local_3d0 != (undefined1  [8])&local_3c0) {
        operator_delete((void *)local_3d0,local_3c0 + 1);
      }
      PVar9 = PVar9 + PRECISION_MEDIUMP;
    } while (PVar9 != PRECISION_LAST);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} highp vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tv_unrelated += value;\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} highp vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_0","Invariant value set using a loop",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tv_unrelated = value;\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_1","Invariant value set using a loop",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tgl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n\t\telse\n\t\t\tv_unrelated = value + a_input;\n\t}\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tgl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n\t\telse\n\t\t\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t}\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_2","Invariant value set using a loop",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tgl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n\t\tv_unrelated = gl_Position.xyzx * a_input;\n\t}\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tgl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n\t}\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_3","Invariant value set using a loop",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_318,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 value1 = a_input;\n\t${IN_PREC} vec4 value2 = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue1 *= ${LOOP_MULTIPLIER};\n\t\tv_unrelated = v_unrelated*1.3 + a_input.xyzx * value1.xyxw;\n\t}\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue2 *= ${LOOP_MULTIPLIER};\n\t\tposition = position*1.3 + a_input.xyzx * value2.xyxw;\n\t}\n\tgl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_658,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 value2 = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue2 *= ${LOOP_MULTIPLIER};\n\t\tposition = position*1.3 + a_input.xyzx * value2.xyxw;\n\t}\n\tgl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n}\n"
               ,(char *)&local_140,(FormatArgumentList *)pcVar7);
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_4","Invariant value set using a loop",(string *)local_318,
               (string *)local_658);
    tcu::TestNode::addChild(node,(TestNode *)pBVar3);
    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_140);
    lVar5 = local_50 + 1;
  } while (lVar5 != 3);
  return 3;
}

Assistant:

void ShaderInvarianceTests::init (void)
{
	static const struct PrecisionCase
	{
		glu::Precision	prec;
		const char*		name;

		// set literals in the glsl to be in the representable range
		const char*		highValue;		// !< highValue < maxValue
		const char*		invHighValue;
		const char*		mediumValue;	// !< mediumValue^2 < maxValue
		const char*		lowValue;		// !< lowValue^4 < maxValue
		const char*		invlowValue;
		int				loopIterations;
		int				loopPartialIterations;
		int				loopNormalizationExponent;
		const char*		loopNormalizationConstantLiteral;
		const char*		loopMultiplier;
		const char*		sumLoopNormalizationConstantLiteral;
	} precisions[] =
	{
		{ glu::PRECISION_HIGHP,		"highp",	"1.0e20",	"1.0e-20",	"1.0e14",	"1.0e9",	"1.0e-9",	14,	11,	2,	"1.0e4",	"1.9",	"1.0e3"	},
		{ glu::PRECISION_MEDIUMP,	"mediump",	"1.0e4",	"1.0e-4",	"1.0e2",	"1.0e1",	"1.0e-1",	13,	11,	2,	"1.0e4",	"1.9",	"1.0e3"	},
		{ glu::PRECISION_LOWP,		"lowp",		"0.9",		"1.1",		"1.1",		"1.15",		"0.87",		6,	2,	0,	"2.0",		"1.1",	"1.0"	},
	};

	for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); ++precNdx)
	{
		const char* const			precisionName	= precisions[precNdx].name;
		const glu::Precision		precision		= precisions[precNdx].prec;
		tcu::TestCaseGroup* const	group			= new tcu::TestCaseGroup(m_testCtx, precisionName, "Invariance tests using the given precision.");

		const FormatArgumentList	args			= FormatArgumentList()
														<< FormatArgument("VERSION",				"")
														<< FormatArgument("IN",						"attribute")
														<< FormatArgument("OUT",					"varying")
														<< FormatArgument("IN_PREC",				precisionName)
														<< FormatArgument("HIGH_VALUE",				de::toString(precisions[precNdx].highValue))
														<< FormatArgument("HIGH_VALUE_INV",			de::toString(precisions[precNdx].invHighValue))
														<< FormatArgument("MEDIUM_VALUE",			de::toString(precisions[precNdx].mediumValue))
														<< FormatArgument("LOW_VALUE",				de::toString(precisions[precNdx].lowValue))
														<< FormatArgument("LOW_VALUE_INV",			de::toString(precisions[precNdx].invlowValue))
														<< FormatArgument("LOOP_ITERS",				de::toString(precisions[precNdx].loopIterations))
														<< FormatArgument("LOOP_ITERS_PARTIAL",		de::toString(precisions[precNdx].loopPartialIterations))
														<< FormatArgument("LOOP_NORM_FRACT_EXP",	de::toString(precisions[precNdx].loopNormalizationExponent))
														<< FormatArgument("LOOP_NORM_LITERAL",		precisions[precNdx].loopNormalizationConstantLiteral)
														<< FormatArgument("LOOP_MULTIPLIER",		precisions[precNdx].loopMultiplier)
														<< FormatArgument("SUM_LOOP_NORM_LITERAL",	precisions[precNdx].sumLoopNormalizationConstantLiteral);

		addChild(group);

		// subexpression cases
		{
			// First shader shares "${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy" with unrelated output variable. Reordering might result in accuracy loss
			// due to the high exponent. In the second shader, the high exponent may be removed during compilation.

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_0", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	v_unrelated = a_input.xzxz + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * (1.08 * a_input.zyzy * a_input.xzxz) * ${HIGH_VALUE_INV} * (a_input.z * a_input.zzxz - a_input.z * a_input.zzxz) + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) / ${HIGH_VALUE};\n"
							"	gl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n"
							"}\n", args)));

			// In the first shader, the unrelated variable "d" has mathematically the same expression as "e", but the different
			// order of calculation might cause different results.

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_1", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy - ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n"
							"	${IN_PREC} vec4 d = (${LOW_VALUE} * a_input.yzxx) * (${LOW_VALUE} * a_input.yzzw) * (1.1*${LOW_VALUE_INV} * a_input.yzxx) * (${LOW_VALUE_INV} * a_input.xzzy);\n"
							"	${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n"
							"	v_unrelated = a + b + c + d + e;\n"
							"	gl_Position = a_input + fract(c) + e;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n"
							"	${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + fract(c) + e;\n"
							"}\n", args)));

			// Intermediate values used by an unrelated output variable

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_2", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n"
							"	${IN_PREC} vec4 b = (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) * (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	${IN_PREC} vec4 c = a * a;\n"
							"	${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	v_unrelated = a + b + c + d;\n"
							"	gl_Position = a_input + d;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n"
							"	${IN_PREC} vec4 c = a * a;\n"
							"	${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + d;\n"
							"}\n", args)));

			// Invariant value can be calculated using unrelated value

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_3", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} float x = a_input.x * 0.2;\n"
							"	${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n"
							"	${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n"
							"	${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n"
							"	${IN_PREC} vec4 f = x*a + x*b + x*c;\n"
							"	v_unrelated = f;\n"
							"	${IN_PREC} vec4 g = x * (a + b + c);\n"
							"	gl_Position = a_input + g;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} float x = a_input.x * 0.2;\n"
							"	${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n"
							"	${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n"
							"	${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 g = x * (a + b + c);\n"
							"	gl_Position = a_input + g;\n"
							"}\n", args)));
		}

		// shared subexpression of different precision
		{
			for (int precisionOther = glu::PRECISION_LOWP; precisionOther != glu::PRECISION_LAST; ++precisionOther)
			{
				const char* const		unrelatedPrec				= glu::getPrecisionName((glu::Precision)precisionOther);
				const glu::Precision	minPrecision				= (precisionOther < (int)precision) ? ((glu::Precision)precisionOther) : (precision);
				const char* const		multiplierStr				= (minPrecision == glu::PRECISION_LOWP) ? ("0.8, 0.4, -0.2, 0.3") : ("1.0e1, 5.0e2, 2.0e2, 1.0");
				const char* const		normalizationStrUsed		= (minPrecision == glu::PRECISION_LOWP) ? ("vec4(fract(used2).xyz, 0.0)") : ("vec4(fract(used2 / 1.0e2).xyz - fract(used2 / 1.0e3).xyz, 0.0)");
				const char* const		normalizationStrUnrelated	= (minPrecision == glu::PRECISION_LOWP) ? ("vec4(fract(unrelated2).xyz, 0.0)") : ("vec4(fract(unrelated2 / 1.0e2).xyz - fract(unrelated2 / 1.0e3).xyz, 0.0)");

				group->addChild(new BasicInvarianceTest(m_context, ("subexpression_precision_" + std::string(unrelatedPrec)).c_str(), "Shader shares subexpression of different precision with an unrelated variable.",
					formatGLSL(	"${VERSION}"
								"${IN} ${IN_PREC} vec4 a_input;\n"
								"${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\n"
								"invariant gl_Position;\n"
								"void main ()\n"
								"{\n"
								"	${UNRELATED_PREC} vec4 unrelated0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${UNRELATED_PREC} vec4 unrelated1 = vec4(${MULTIPLIER}) * unrelated0.xywz + unrelated0;\n"
								"	${UNRELATED_PREC} vec4 unrelated2 = refract(unrelated1, unrelated0, distance(unrelated0, unrelated1));\n"
								"	v_unrelated = a_input + 0.02 * ${NORMALIZE_UNRELATED};\n"
								"	${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n"
								"	${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n"
								"	gl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n"
								"}\n", FormatArgumentList(args)
											<< FormatArgument("UNRELATED_PREC",			unrelatedPrec)
											<< FormatArgument("MULTIPLIER",				multiplierStr)
											<< FormatArgument("NORMALIZE_USED",			normalizationStrUsed)
											<< FormatArgument("NORMALIZE_UNRELATED",	normalizationStrUnrelated)),
					formatGLSL(	"${VERSION}"
								"${IN} ${IN_PREC} vec4 a_input;\n"
								"${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\n"
								"invariant gl_Position;\n"
								"void main ()\n"
								"{\n"
								"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
								"	${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n"
								"	${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n"
								"	gl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n"
								"}\n", FormatArgumentList(args)
											<< FormatArgument("UNRELATED_PREC",			unrelatedPrec)
											<< FormatArgument("MULTIPLIER",				multiplierStr)
											<< FormatArgument("NORMALIZE_USED",			normalizationStrUsed)
											<< FormatArgument("NORMALIZE_UNRELATED",	normalizationStrUnrelated))));
			}
		}

		// loops
		{
			group->addChild(new BasicInvarianceTest(m_context, "loop_0", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} highp vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		v_unrelated += value;\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} highp vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_1", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			v_unrelated = value;\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_2", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			gl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"		else\n"
							"			v_unrelated = value + a_input;\n"
							"	}\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			gl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"		else\n"
							"			v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	}\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_3", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		gl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"		v_unrelated = gl_Position.xyzx * a_input;\n"
							"	}\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		gl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"	}\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_4", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 value1 = a_input;\n"
							"	${IN_PREC} vec4 value2 = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value1 *= ${LOOP_MULTIPLIER};\n"
							"		v_unrelated = v_unrelated*1.3 + a_input.xyzx * value1.xyxw;\n"
							"	}\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value2 *= ${LOOP_MULTIPLIER};\n"
							"		position = position*1.3 + a_input.xyzx * value2.xyxw;\n"
							"	}\n"
							"	gl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 value2 = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value2 *= ${LOOP_MULTIPLIER};\n"
							"		position = position*1.3 + a_input.xyzx * value2.xyxw;\n"
							"	}\n"
							"	gl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"}\n", args)));
		}
	}
}